

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

int solver2_enqueue(sat_solver2 *s,lit l,cla from)

{
  int iVar1;
  int iVar2;
  int v;
  cla from_local;
  lit l_local;
  sat_solver2 *s_local;
  
  iVar1 = lit_var(l);
  iVar2 = var_value(s,iVar1);
  if (iVar2 == 3) {
    iVar2 = lit_sign(l);
    var_set_value(s,iVar1,iVar2);
    iVar2 = solver2_dlevel(s);
    var_set_level(s,iVar1,iVar2);
    s->reasons[iVar1] = from;
    iVar2 = s->qtail;
    s->qtail = iVar2 + 1;
    s->trail[iVar2] = l;
    order_assigned(s,iVar1);
    s_local._4_4_ = 1;
  }
  else {
    iVar1 = var_value(s,iVar1);
    iVar2 = lit_sign(l);
    s_local._4_4_ = (uint)(iVar1 == iVar2);
  }
  return s_local._4_4_;
}

Assistant:

static inline int solver2_enqueue(sat_solver2* s, lit l, cla from)
{
    int v = lit_var(l);
#ifdef VERBOSEDEBUG
    Abc_Print(1,L_IND"enqueue("L_LIT")\n", L_ind, L_lit(l));
#endif
    if (var_value(s, v) != varX)
        return var_value(s, v) == lit_sign(l);
    else
    {  // New fact -- store it.
#ifdef VERBOSEDEBUG
        Abc_Print(1,L_IND"bind("L_LIT")\n", L_ind, L_lit(l));
#endif
        var_set_value( s, v, lit_sign(l) );
        var_set_level( s, v, solver2_dlevel(s) );
        s->reasons[v] = from;  //  = from << 1;
        s->trail[s->qtail++] = l;
        order_assigned(s, v);
        return true;
    }
}